

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptorProto::InternalSwap
          (FileDescriptorProto *this,FileDescriptorProto *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  void *pvVar2;
  FileOptions *pFVar3;
  SourceCodeInfo *pSVar4;
  SourceCodeInfo *pSVar5;
  ulong uVar6;
  string *psVar7;
  UnknownFieldSet *other_00;
  Arena *arena;
  Arena *pAVar8;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  pvVar2 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if (((ulong)pvVar2 & 1) == 0) goto LAB_002c97a5;
LAB_002c9794:
    other_00 = (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar2 & 1) != 0) goto LAB_002c9794;
    other_00 = internal::InternalMetadata::
               mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
  }
  internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>(this_00,other_00);
LAB_002c97a5:
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             &(other->dependency_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             &(other->message_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(other->enum_type_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->service_).super_RepeatedPtrFieldBase,
             &(other->service_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(other->extension_).super_RepeatedPtrFieldBase);
  RepeatedField<int>::InternalSwap(&this->public_dependency_,&other->public_dependency_);
  RepeatedField<int>::InternalSwap(&this->weak_dependency_,&other->weak_dependency_);
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  uVar6 = (ulong)arena & 1;
  pAVar8 = arena;
  if (uVar6 != 0) {
    pAVar8 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->name_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar7 = internal::ArenaStringPtr::Mutable
                       (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                        pAVar8);
    internal::ArenaStringPtr::Mutable
              (&other->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar8);
    std::__cxx11::string::swap((string *)psVar7);
    arena = (Arena *)this_00->ptr_;
    uVar6 = (ulong)((uint)arena & 1);
  }
  pAVar8 = arena;
  if (uVar6 != 0) {
    pAVar8 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->package_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar7 = internal::ArenaStringPtr::Mutable
                       (&this->package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                        pAVar8);
    internal::ArenaStringPtr::Mutable
              (&other->package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,pAVar8);
    std::__cxx11::string::swap((string *)psVar7);
    arena = (Arena *)this_00->ptr_;
    uVar6 = (ulong)((uint)arena & 1);
  }
  if (uVar6 != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (((this->syntax_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_) ||
     ((other->syntax_).ptr_ != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    psVar7 = internal::ArenaStringPtr::Mutable
                       (&this->syntax_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
                        arena);
    internal::ArenaStringPtr::Mutable
              (&other->syntax_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,arena);
    std::__cxx11::string::swap((string *)psVar7);
  }
  pFVar3 = this->options_;
  pSVar4 = this->source_code_info_;
  pSVar5 = other->source_code_info_;
  this->options_ = other->options_;
  this->source_code_info_ = pSVar5;
  other->options_ = pFVar3;
  other->source_code_info_ = pSVar4;
  return;
}

Assistant:

void FileDescriptorProto::InternalSwap(FileDescriptorProto* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  dependency_.InternalSwap(&other->dependency_);
  message_type_.InternalSwap(&other->message_type_);
  enum_type_.InternalSwap(&other->enum_type_);
  service_.InternalSwap(&other->service_);
  extension_.InternalSwap(&other->extension_);
  public_dependency_.InternalSwap(&other->public_dependency_);
  weak_dependency_.InternalSwap(&other->weak_dependency_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  package_.Swap(&other->package_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  syntax_.Swap(&other->syntax_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(FileDescriptorProto, source_code_info_)
      + sizeof(FileDescriptorProto::source_code_info_)
      - PROTOBUF_FIELD_OFFSET(FileDescriptorProto, options_)>(
          reinterpret_cast<char*>(&options_),
          reinterpret_cast<char*>(&other->options_));
}